

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::formatReconstructedExpression(Catch *this,ostream *os,string *lhs,StringRef op,string *rhs)

{
  undefined8 in_RAX;
  long lVar1;
  ostream *poVar2;
  char cVar3;
  char *pcVar4;
  undefined8 *puVar5;
  undefined8 uStack_38;
  
  puVar5 = (undefined8 *)op.m_size;
  uStack_38 = in_RAX;
  if ((ulong)(puVar5[1] + *(long *)(os + 8)) < 0x28) {
    lVar1 = std::__cxx11::string::find((char)os,10);
    if (lVar1 == -1) {
      lVar1 = std::__cxx11::string::find((char)op.m_size,10);
      if (lVar1 == -1) {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)this,*(char **)os,*(long *)(os + 8));
        cVar3 = ' ';
        uStack_38._0_5_ = CONCAT14(0x20,(undefined4)uStack_38);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(char *)((long)&uStack_38 + 4),1);
        poVar2 = (ostream *)std::ostream::write((char *)poVar2,(long)lhs);
        pcVar4 = (char *)((long)&uStack_38 + 5);
        goto LAB_0018c567;
      }
    }
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this,*(char **)os,*(long *)(os + 8));
  cVar3 = '\n';
  uStack_38._0_7_ = CONCAT16(10,(undefined6)uStack_38);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)((long)&uStack_38 + 6),1);
  poVar2 = (ostream *)std::ostream::write((char *)poVar2,(long)lhs);
  pcVar4 = (char *)((long)&uStack_38 + 7);
LAB_0018c567:
  *pcVar4 = cVar3;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)*puVar5,puVar5[1]);
  return;
}

Assistant:

void formatReconstructedExpression(std::ostream &os, std::string const &lhs, StringRef op, std::string const &rhs) {
        if (lhs.size() + rhs.size() < 40 &&
            lhs.find('\n') == std::string::npos &&
            rhs.find('\n') == std::string::npos)
            os << lhs << ' ' << op << ' ' << rhs;
        else
            os << lhs << '\n' << op << '\n' << rhs;
    }